

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semiintersect_iterator.hpp
# Opt level: O1

outer_range_iterator __thiscall
burst::
semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
::skip_while_less(semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
                  *this,outer_range_iterator range,outer_range_iterator candidate)

{
  int *piVar1;
  int *piVar2;
  
  if (range._M_current != candidate._M_current) {
    do {
      piVar1 = ((range._M_current)->
               super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
               ).
               super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
               .
               super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
               .m_Begin;
      if ((piVar1 == ((range._M_current)->
                     super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
                     ).
                     super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
                     .
                     super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                     .m_End) ||
         (piVar2 = ((candidate._M_current)->
                   super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
                   ).
                   super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
                   .
                   super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                   .m_Begin,
         piVar2 == ((candidate._M_current)->
                   super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
                   ).
                   super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
                   .
                   super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                   .m_End)) {
LAB_001e9bc9:
        __assert_fail("!empty()","/usr/include/boost/range/iterator_range_core.hpp",0xff,
                      "reference boost::iterator_range_detail::iterator_range_base<const int *, boost::iterators::incrementable_traversal_tag>::front() const [IteratorT = const int *, TraversalTag = boost::iterators::incrementable_traversal_tag]"
                     );
      }
      if (*piVar1 < *piVar2) {
        skip_to_lower_bound<boost::iterator_range<int_const*>,int,std::less<void>>(range._M_current)
        ;
        piVar1 = ((range._M_current)->
                 super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
                 ).
                 super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
                 .
                 super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                 .m_Begin;
        if (piVar1 == ((range._M_current)->
                      super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
                      ).
                      super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
                      .
                      super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                      .m_End) {
          return (outer_range_iterator)range._M_current;
        }
        piVar2 = ((candidate._M_current)->
                 super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
                 ).
                 super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
                 .
                 super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                 .m_Begin;
        if (piVar2 == ((candidate._M_current)->
                      super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
                      ).
                      super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
                      .
                      super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                      .m_End) goto LAB_001e9bc9;
        if (*piVar2 < *piVar1) {
          return (outer_range_iterator)range._M_current;
        }
      }
      range._M_current = range._M_current + 1;
    } while (range._M_current != candidate._M_current);
  }
  return (outer_range_iterator)range._M_current;
}

Assistant:

outer_range_iterator skip_while_less (outer_range_iterator range, outer_range_iterator candidate)
        {
            while (range != candidate)
            {
                if (m_compare(range->front(), candidate->front()))
                {
                    skip_to_lower_bound(*range, candidate->front(), m_compare);
                    if (range->empty() || m_compare(candidate->front(), range->front()))
                    {
                        break;
                    }
                }

                ++range;
            }

            return range;
        }